

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::save(Image *this,FILE *f,Format format)

{
  anon_class_8_1_54a39806 local_28;
  Format local_1c;
  FILE *pFStack_18;
  Format format_local;
  FILE *f_local;
  Image *this_local;
  
  local_28.f = f;
  local_1c = format;
  pFStack_18 = f;
  f_local = (FILE *)this;
  save_helper<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0>(this,format,&local_28);
  return;
}

Assistant:

void Image::save(FILE* f, Format format) const {
  this->save_helper(format, [f](const void* data, size_t size) {
    fwritex(f, data, size);
  });
}